

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_utils.cpp
# Opt level: O1

string * cornelich::make_file
                   (string *__return_storage_ptr__,string *base_path,string *cycle_string,
                   string *file_name,bool append)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  path p;
  path dir;
  path file;
  path local_d0;
  path local_b0;
  path local_90;
  path local_70;
  path local_50;
  
  paVar1 = &local_d0.m_pathname.field_2;
  pcVar3 = (base_path->_M_dataplus)._M_p;
  local_d0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + base_path->_M_string_length);
  paVar2 = &local_70.m_pathname.field_2;
  pcVar3 = (cycle_string->_M_dataplus)._M_p;
  local_70.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + cycle_string->_M_string_length);
  boost::filesystem::path::operator/=(&local_d0,&local_70);
  local_b0.m_pathname._M_dataplus._M_p = (pointer)&local_b0.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_pathname._M_dataplus._M_p == paVar1) {
    local_b0.m_pathname.field_2._8_8_ = local_d0.m_pathname.field_2._8_8_;
  }
  else {
    local_b0.m_pathname._M_dataplus._M_p = local_d0.m_pathname._M_dataplus._M_p;
  }
  local_b0.m_pathname._M_string_length = local_d0.m_pathname._M_string_length;
  local_d0.m_pathname._M_string_length = 0;
  local_d0.m_pathname.field_2._M_local_buf[0] = '\0';
  local_d0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_pathname._M_dataplus._M_p);
  }
  if (append) {
    bVar4 = false;
  }
  else {
    pcVar3 = (file_name->_M_dataplus)._M_p;
    local_70.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + file_name->_M_string_length);
    local_d0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0.m_pathname._M_dataplus._M_p,
               local_b0.m_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_b0.m_pathname._M_string_length);
    boost::filesystem::path::operator/=(&local_d0,&local_70);
    boost::filesystem::detail::status(&local_90,(error_code *)&local_d0);
    bVar4 = (uint)local_90.m_pathname._M_dataplus._M_p < 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.m_pathname._M_dataplus._M_p);
    }
  }
  if (bVar4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    boost::filesystem::detail::status(&local_90,(error_code *)&local_b0);
    if ((uint)local_90.m_pathname._M_dataplus._M_p != 3) {
      boost::filesystem::detail::create_directories(&local_b0,(error_code *)0x0);
    }
    paVar2 = &local_50.m_pathname.field_2;
    pcVar3 = (file_name->_M_dataplus)._M_p;
    local_50.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + file_name->_M_string_length);
    paVar1 = &local_90.m_pathname.field_2;
    local_90.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0.m_pathname._M_dataplus._M_p,
               local_b0.m_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_b0.m_pathname._M_string_length);
    boost::filesystem::path::operator/=(&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_50.m_pathname._M_dataplus._M_p);
    }
    boost::filesystem::detail::status(&local_50,(error_code *)&local_90);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((uint)local_50.m_pathname._M_dataplus._M_p < 2 && !append) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_90.m_pathname._M_dataplus._M_p,
                 local_90.m_pathname._M_dataplus._M_p +
                 (long)(_func_int ***)local_90.m_pathname._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.m_pathname._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != &local_b0.m_pathname.field_2) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_file(const std::string & base_path,
                      const std::string & cycle_string,
                      const std::string & file_name,
                      bool append)
{
    const auto dir = fs::path(base_path) / cycle_string;
    if(!append && !fs::exists(dir / file_name))
    {
        return {};
    }

    if(!fs::is_directory(dir))
    {
        fs::create_directories(dir);
    }

    const auto file = dir / file_name;
    if(fs::exists(file))
    {
        // "File exists:" << file;
    }
    else if(append)
    {
        // "File does not exist: " << file;
    }
    else
    {
        return {};
    }
    return file.string();
}